

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__gif_test(stbi__context *s)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  uint uVar3;
  uint uVar4;
  
  psVar2 = s->img_buffer;
  if (s->img_buffer_end <= psVar2) {
    if (s->read_from_callbacks == 0) {
      uVar3 = 0;
      goto LAB_001104c7;
    }
    stbi__refill_buffer(s);
    psVar2 = s->img_buffer;
  }
  psVar1 = psVar2 + 1;
  s->img_buffer = psVar1;
  uVar3 = 0;
  uVar4 = 0;
  if (*psVar2 == 'G') {
    if (s->img_buffer_end <= psVar1) {
      if (s->read_from_callbacks == 0) goto LAB_001104c7;
      stbi__refill_buffer(s);
      psVar1 = s->img_buffer;
    }
    psVar2 = psVar1 + 1;
    s->img_buffer = psVar2;
    if (*psVar1 == 'I') {
      uVar3 = uVar4;
      if (s->img_buffer_end <= psVar2) {
        if (s->read_from_callbacks == 0) goto LAB_001104c7;
        stbi__refill_buffer(s);
        psVar2 = s->img_buffer;
      }
      psVar1 = psVar2 + 1;
      s->img_buffer = psVar1;
      if (*psVar2 == 'F') {
        if (s->img_buffer_end <= psVar1) {
          if (s->read_from_callbacks == 0) goto LAB_001104c7;
          stbi__refill_buffer(s);
          psVar1 = s->img_buffer;
        }
        psVar2 = psVar1 + 1;
        s->img_buffer = psVar2;
        if (*psVar1 == '8') {
          if (s->img_buffer_end <= psVar2) {
            if (s->read_from_callbacks == 0) goto LAB_001104c7;
            stbi__refill_buffer(s);
            psVar2 = s->img_buffer;
          }
          psVar1 = psVar2 + 1;
          s->img_buffer = psVar1;
          if ((*psVar2 == '9') || (*psVar2 == '7')) {
            if (s->img_buffer_end <= psVar1) {
              if (s->read_from_callbacks == 0) goto LAB_001104c7;
              stbi__refill_buffer(s);
              psVar1 = s->img_buffer;
            }
            s->img_buffer = psVar1 + 1;
            uVar3 = (uint)(*psVar1 == 'a');
          }
        }
      }
    }
  }
LAB_001104c7:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return uVar3;
}

Assistant:

static int stbi__gif_test(stbi__context *s)
{
   int r = stbi__gif_test_raw(s);
   stbi__rewind(s);
   return r;
}